

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::deleteRenderbuffers
          (ReferenceContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  bool bVar6;
  
  if (0 < numRenderbuffers) {
    p_Var1 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
    uVar5 = 0;
    do {
      uVar2 = renderbuffers[uVar5];
      p_Var3 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var4 = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0 && uVar2 != 0) {
        do {
          bVar6 = (uint)*(size_t *)(p_Var3 + 1) < uVar2;
          if (!bVar6) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar6];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var4 != p_Var1) &&
            ((uint)((_Rb_tree_header *)p_Var4)->_M_node_count <= uVar2)) &&
           (*(Renderbuffer **)((long)p_Var4 + 0x28) != (Renderbuffer *)0x0)) {
          deleteRenderbuffer(this,*(Renderbuffer **)((long)p_Var4 + 0x28));
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)numRenderbuffers);
  }
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
	{
		deUint32		name			= renderbuffers[i];
		Renderbuffer*	renderbuffer	= name ? m_renderbuffers.find(name) : DE_NULL;

		if (renderbuffer)
			deleteRenderbuffer(renderbuffer);
	}
}